

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  int *piVar1;
  float fVar2;
  uchar filterType;
  byte bVar3;
  LodePNGColorType LVar4;
  undefined4 uVar5;
  size_t sVar6;
  uint uVar7;
  uchar *puVar8;
  ulong uVar9;
  long lVar10;
  uchar *puVar11;
  LodePNGFilterStrategy LVar12;
  ulong uVar13;
  uint uVar14;
  ucvector *puVar15;
  long lVar16;
  uchar *puVar17;
  ulong uVar18;
  uchar *puVar19;
  ulong uVar20;
  uint uVar21;
  float *pfVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  size_t *psVar26;
  int iVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  uchar *dummy;
  size_t size [5];
  ucvector attempt_1 [5];
  ucvector attempt [5];
  uchar *local_550;
  ulong local_548;
  ulong local_530;
  uchar *local_4f8;
  ulong local_4f0;
  float local_4e8 [2];
  ulong auStack_4e0 [5];
  undefined1 local_4b8 [32];
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *local_498;
  void *pvStack_490;
  ucvector local_438 [43];
  ulong length;
  
  LVar4 = info->colortype;
  iVar27 = 0;
  if ((ulong)LVar4 < 7) {
    iVar27 = *(int *)(&DAT_00112b04 + (ulong)LVar4 * 4);
  }
  iVar27 = iVar27 * info->bitdepth;
  if (iVar27 == 0) {
    return 0x1f;
  }
  LVar12 = settings->filter_strategy;
  if (info->bitdepth < 8) {
    LVar12 = LFS_ZERO;
  }
  if (LVar4 == LCT_PALETTE) {
    LVar12 = LFS_ZERO;
  }
  if (settings->filter_palette_zero == 0) {
    LVar12 = settings->filter_strategy;
  }
  if (LFS_PREDEFINED < LVar12) {
    return 0x58;
  }
  uVar14 = w * iVar27 + 7;
  uVar21 = uVar14 >> 3;
  length = (ulong)uVar21;
  uVar18 = (ulong)(iVar27 + 7U >> 3);
  switch(LVar12) {
  case LFS_ZERO:
    if (h != 0) {
      puVar19 = out + 1;
      uVar18 = 0;
      do {
        out[(length + 1) * uVar18] = '\0';
        if (7 < uVar14) {
          uVar23 = 0;
          do {
            puVar19[uVar23] = in[uVar23];
            uVar23 = uVar23 + 1;
          } while (length != uVar23);
        }
        uVar18 = uVar18 + 1;
        puVar19 = puVar19 + length + 1;
        in = in + length;
      } while (uVar18 != h);
    }
    break;
  case LFS_MINSUM:
    local_438[0].data = (uchar *)0x0;
    local_438[0].size = 0;
    local_438[0].allocsize = 0;
    uVar7 = ucvector_reserve(local_438,length);
    if (uVar7 == 0) {
      return 0x53;
    }
    uVar23 = 0xffffffffffffffff;
    puVar15 = local_438;
    do {
      puVar15 = puVar15 + 1;
      puVar15[-1].size = length;
      if (uVar23 == 3) {
        if (h != 0) {
          uVar23 = 1;
          if (1 < uVar21) {
            uVar23 = length;
          }
          puVar19 = out + 1;
          uVar24 = 0;
          local_548 = 0;
          uVar20 = 0;
          puVar17 = (uchar *)0x0;
          do {
            lVar16 = uVar24 * length;
            uVar9 = 0;
            do {
              puVar8 = local_438[uVar9].data;
              filterScanline(puVar8,in + lVar16,puVar17,length,uVar18,(uchar)uVar9);
              *(undefined8 *)(local_4b8 + uVar9 * 8) = 0;
              if (uVar9 == 0) {
                if (7 < uVar14) {
                  uVar13 = 0;
                  puVar11 = (uchar *)local_4b8._0_8_;
                  do {
                    puVar11 = puVar11 + puVar8[uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar23 != uVar13);
                  goto LAB_00111388;
                }
              }
              else if (7 < uVar14) {
                puVar11 = *(uchar **)(local_4b8 + uVar9 * 8);
                uVar13 = 0;
                do {
                  bVar3 = puVar8[uVar13];
                  uVar21 = bVar3 ^ 0xff;
                  if (-1 < (char)bVar3) {
                    uVar21 = (uint)bVar3;
                  }
                  puVar11 = puVar11 + uVar21;
                  uVar13 = uVar13 + 1;
                } while (uVar23 != uVar13);
LAB_00111388:
                *(uchar **)(local_4b8 + uVar9 * 8) = puVar11;
              }
              if ((uVar9 == 0) || (*(ulong *)(local_4b8 + uVar9 * 8) < uVar20)) {
                uVar20 = *(ulong *)(local_4b8 + uVar9 * 8);
                local_548 = uVar9 & 0xffffffff;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != 5);
            out[(length + 1) * uVar24] = (uchar)local_548;
            if (7 < uVar14) {
              puVar17 = local_438[local_548 & 0xff].data;
              uVar9 = 0;
              do {
                puVar19[uVar9] = puVar17[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar23 != uVar9);
            }
            uVar24 = uVar24 + 1;
            puVar19 = puVar19 + length + 1;
            puVar17 = in + lVar16;
          } while (uVar24 != h);
        }
        lVar16 = 0;
        do {
          *(undefined8 *)((long)&local_438[0].size + lVar16) = 0;
          *(undefined8 *)((long)&local_438[0].allocsize + lVar16) = 0;
          free(*(void **)((long)&local_438[0].data + lVar16));
          *(undefined8 *)((long)&local_438[0].data + lVar16) = 0;
          lVar16 = lVar16 + 0x18;
        } while (lVar16 != 0x78);
        bVar28 = true;
        goto LAB_0011144b;
      }
      puVar15->data = (uchar *)0x0;
      puVar15->size = 0;
      puVar15->allocsize = 0;
      uVar7 = ucvector_reserve(puVar15,length);
      uVar23 = uVar23 + 1;
    } while (uVar7 != 0);
    goto LAB_00110fbb;
  case LFS_ENTROPY:
    local_4b8._0_8_ = (uchar *)0x0;
    local_4b8._8_8_ = 0;
    local_4b8._16_8_ = 0;
    uVar7 = ucvector_reserve((ucvector *)local_4b8,length);
    if (uVar7 == 0) {
      return 0x53;
    }
    uVar23 = 0xffffffffffffffff;
    puVar15 = (ucvector *)(local_4b8 + 0x18);
    do {
      puVar15[-1].size = length;
      if (uVar23 == 3) {
        if (h != 0) {
          lVar16 = length + 1;
          uVar23 = 1;
          if (1 < uVar21) {
            uVar23 = length;
          }
          puVar19 = out + 1;
          fVar2 = 0.0;
          uVar20 = 0;
          local_550 = (uchar *)0x0;
          puVar17 = (uchar *)0x0;
          do {
            lVar25 = uVar20 * length;
            uVar24 = 0;
            do {
              puVar8 = *(uchar **)(local_4b8 + uVar24 * 0x18);
              filterScanline(puVar8,in + lVar25,puVar17,length,uVar18,(uchar)uVar24);
              memset(local_438,0,0x400);
              if (7 < uVar14) {
                uVar9 = 0;
                do {
                  piVar1 = (int *)((long)&local_438[0].data + (ulong)puVar8[uVar9] * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = uVar9 + 1;
                } while (uVar23 != uVar9);
              }
              piVar1 = (int *)((long)&local_438[0].data + uVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)auStack_4e0 + uVar24 * 4 + -8) = 0;
              fVar29 = 0.0;
              lVar10 = 0;
              do {
                uVar21 = *(uint *)((long)&local_438[0].data + lVar10 * 4);
                fVar30 = 0.0;
                if (uVar21 != 0) {
                  fVar30 = (float)uVar21 / (float)(int)lVar16;
                  fVar32 = 0.0;
                  for (fVar31 = 1.0 / fVar30; 32.0 < fVar31; fVar31 = fVar31 * 0.0625) {
                    fVar32 = fVar32 + 4.0;
                  }
                  for (; 2.0 < fVar31; fVar31 = fVar31 * 0.5) {
                    fVar32 = fVar32 + 1.0;
                  }
                  fVar30 = fVar30 * ((fVar31 * fVar31 * 3.0 * -0.5 +
                                      (fVar31 * fVar31 * fVar31) / 3.0 + fVar31 * 3.0 + -1.83333) *
                                     1.442695 + fVar32);
                }
                fVar29 = fVar29 + fVar30;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 0x100);
              *(float *)((long)auStack_4e0 + uVar24 * 4 + -8) = fVar29;
              if ((uVar24 == 0) ||
                 (pfVar22 = (float *)((long)auStack_4e0 + uVar24 * 4 + -8),
                 *pfVar22 <= fVar2 && fVar2 != *pfVar22)) {
                fVar2 = *(float *)((long)auStack_4e0 + uVar24 * 4 + -8);
                local_550 = (uchar *)(uVar24 & 0xffffffff);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != 5);
            out[lVar16 * uVar20] = (uchar)local_550;
            if (7 < uVar14) {
              lVar10 = *(long *)(local_4b8 + (long)local_550 * 0x18);
              uVar24 = 0;
              do {
                puVar19[uVar24] = *(uchar *)(lVar10 + uVar24);
                uVar24 = uVar24 + 1;
              } while (uVar23 != uVar24);
            }
            uVar20 = uVar20 + 1;
            puVar19 = puVar19 + lVar16;
            puVar17 = in + lVar25;
          } while (uVar20 != h);
        }
        lVar16 = 0;
        do {
          *(undefined8 *)(local_4b8 + lVar16 + 8) = 0;
          *(undefined8 *)(local_4b8 + lVar16 + 0x10) = 0;
          free(*(void **)(local_4b8 + lVar16));
          *(undefined8 *)(local_4b8 + lVar16) = 0;
          lVar16 = lVar16 + 0x18;
        } while (lVar16 != 0x78);
        bVar28 = true;
        goto LAB_0011144b;
      }
      puVar15->data = (uchar *)0x0;
      puVar15->size = 0;
      puVar15->allocsize = 0;
      uVar7 = ucvector_reserve(puVar15,length);
      puVar15 = puVar15 + 1;
      uVar23 = uVar23 + 1;
    } while (uVar7 != 0);
LAB_00110fbb:
    bVar28 = 3 < uVar23;
LAB_0011144b:
    if (bVar28) {
      return 0;
    }
    return 0x53;
  case LFS_BRUTE_FORCE:
    uVar5 = (settings->zlibsettings).use_lz77;
    local_4b8._8_4_ = (settings->zlibsettings).windowsize;
    local_4b8._12_4_ = (settings->zlibsettings).minmatch;
    local_4b8._16_4_ = (settings->zlibsettings).nicematch;
    local_4b8._20_4_ = (settings->zlibsettings).lazymatching;
    pvStack_490 = (settings->zlibsettings).custom_context;
    local_4b8._4_4_ = uVar5;
    local_4b8._0_4_ = 1;
    local_4b8._24_8_ =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_498 = (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)
                0x0;
    lVar16 = 0;
    do {
      puVar15 = (ucvector *)((long)&local_438[0].data + lVar16);
      puVar15->data = (uchar *)0x0;
      *(undefined8 *)((long)&local_438[0].size + lVar16) = 0;
      *(undefined8 *)((long)&local_438[0].allocsize + lVar16) = 0;
      uVar7 = ucvector_reserve(puVar15,length);
      if (uVar7 != 0) {
        *(ulong *)((long)&local_438[0].size + lVar16) = length;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x78);
    if (h != 0) {
      uVar23 = 1;
      if (1 < uVar21) {
        uVar23 = length;
      }
      local_4f0 = (ulong)h;
      puVar19 = out + 1;
      uVar20 = 0;
      local_530 = 0;
      local_548 = 0;
      local_550 = (uchar *)0x0;
      do {
        lVar16 = uVar20 * length;
        pfVar22 = local_4e8;
        psVar26 = &local_438[0].size;
        uVar24 = 0;
        do {
          sVar6 = *psVar26;
          puVar17 = ((ucvector *)(psVar26 + -1))->data;
          filterScanline(puVar17,in + lVar16,local_550,length,uVar18,(uchar)uVar24);
          auStack_4e0[uVar24 - 1] = 0;
          local_4f8 = (uchar *)0x0;
          if ((_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)
              local_4b8._24_8_ ==
              (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)
              0x0) {
            lodepng_zlib_compress
                      (&local_4f8,(size_t *)pfVar22,puVar17,(ulong)(uint)sVar6,
                       (LodePNGCompressSettings *)local_4b8);
          }
          else {
            (*(code *)local_4b8._24_8_)
                      (&local_4f8,(size_t *)pfVar22,puVar17,(ulong)(uint)sVar6,
                       (LodePNGCompressSettings *)local_4b8);
          }
          free(local_4f8);
          if ((uVar24 == 0) || (auStack_4e0[uVar24 - 1] < local_548)) {
            local_548 = auStack_4e0[uVar24 - 1];
            local_530 = uVar24 & 0xffffffff;
          }
          uVar24 = uVar24 + 1;
          psVar26 = psVar26 + 3;
          pfVar22 = pfVar22 + 2;
        } while (uVar24 != 5);
        out[(length + 1) * uVar20] = (uchar)local_530;
        if (7 < uVar14) {
          puVar17 = local_438[local_530].data;
          uVar24 = 0;
          do {
            puVar19[uVar24] = puVar17[uVar24];
            uVar24 = uVar24 + 1;
          } while (uVar23 != uVar24);
        }
        uVar20 = uVar20 + 1;
        puVar19 = puVar19 + length + 1;
        local_550 = in + lVar16;
      } while (uVar20 != local_4f0);
    }
    lVar16 = 0;
    do {
      *(undefined8 *)((long)&local_438[0].size + lVar16) = 0;
      *(undefined8 *)((long)&local_438[0].allocsize + lVar16) = 0;
      free(*(void **)((long)&local_438[0].data + lVar16));
      *(undefined8 *)((long)&local_438[0].data + lVar16) = 0;
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x78);
    break;
  case LFS_PREDEFINED:
    if (h != 0) {
      puVar17 = out + 1;
      uVar23 = 0;
      puVar19 = (uchar *)0x0;
      do {
        puVar8 = in;
        filterType = settings->predefined_filters[uVar23];
        puVar17[-1] = filterType;
        filterScanline(puVar17,puVar8,puVar19,length,uVar18,filterType);
        uVar23 = uVar23 + 1;
        puVar17 = puVar17 + length + 1;
        in = puVar8 + length;
        puVar19 = puVar8;
      } while (h != uVar23);
    }
  }
  return 0;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y < h; y++)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y < h; y++)
      {
        /*try the 5 filter types*/
        for(type = 0; type < 5; type++)
        {
          filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x < linebytes; x++) sum[type] += (unsigned char)(attempt[type].data[x]);
          }
          else
          {
            for(x = 0; x < linebytes; x++)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type].data[x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
      }
    }

    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    for(y = 0; y < h; y++)
    {
      /*try the 5 filter types*/
      for(type = 0; type < 5; type++)
      {
        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x < 256; x++) count[x] = 0;
        for(x = 0; x < linebytes; x++) count[attempt[type].data[x]]++;
        count[type]++; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x < 256; x++)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }

    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y < h; y++)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type < 5; type++)
    {
      ucvector_init(&attempt[type]);
      ucvector_resize(&attempt[type], linebytes); /*todo: give error if resize failed*/
    }
    for(y = 0; y < h; y++) /*try the 5 filter types*/
    {
      for(type = 0; type < 5; type++)
      {
        unsigned testsize = attempt[type].size;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type].data, testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x < linebytes; x++) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }
    for(type = 0; type < 5; type++) ucvector_cleanup(&attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}